

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O0

bool __thiscall ConditionalEstimator::hasAdditionalEvents(ConditionalEstimator *this)

{
  bool bVar1;
  bool *pbVar2;
  int local_24;
  int local_20;
  int local_1c;
  int i;
  int events;
  ConditionalEstimator *this_local;
  
  if ((this->bRejection & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_1c = -1;
    local_20 = -this->aRejectionInterval[0];
    _i = this;
    while( true ) {
      bVar1 = false;
      if (local_1c < 1) {
        bVar1 = local_20 < this->aRejectionInterval[1];
      }
      if (!bVar1) break;
      local_24 = this->nPre + -1 + local_20;
      pbVar2 = Ring<bool>::operator[](&this->condEventRing,&local_24);
      local_1c = (uint)(*pbVar2 & 1) + local_1c;
      local_20 = local_20 + 1;
    }
    this_local._7_1_ = local_1c != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool ConditionalEstimator::hasAdditionalEvents()
{
	if (!bRejection)
		return false;
	else {
		int events = -1;
		for (int i=-aRejectionInterval[0]; events<1 && i<aRejectionInterval[1]; ++i)
			events += condEventRing[nPre+1-2+i];
		return events;
	}
}